

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O1

SUNErrCode SUNMatScaleAddI_Sparse(sunrealtype c,SUNMatrix A)

{
  int sparsetype;
  sunindextype *psVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  void *pvVar6;
  bool bVar7;
  void *__dest;
  SUNMatrix A_00;
  void *pvVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  double dVar21;
  double dVar22;
  
  psVar1 = (sunindextype *)A->content;
  sparsetype = (int)psVar1[5];
  lVar11 = psVar1[sparsetype == 0];
  lVar13 = psVar1[sparsetype != 0];
  lVar2 = psVar1[7];
  lVar3 = psVar1[6];
  lVar15 = lVar11;
  if (lVar13 < lVar11) {
    lVar15 = lVar13;
  }
  if (lVar15 < 1) {
    lVar20 = 0;
  }
  else {
    lVar10 = 0;
    lVar20 = 0;
    do {
      lVar16 = *(long *)(lVar2 + lVar10 * 8);
      lVar12 = *(long *)(lVar2 + 8 + lVar10 * 8);
      uVar18 = (ulong)(lVar12 <= lVar16);
      if ((lVar16 < lVar12) && (*(long *)(lVar3 + lVar16 * 8) != lVar10)) {
        do {
          lVar16 = lVar16 + 1;
          if (lVar12 == lVar16) break;
        } while (*(long *)(lVar3 + lVar16 * 8) != lVar10);
        uVar18 = (ulong)(lVar12 <= lVar16);
      }
      lVar10 = lVar10 + 1;
      lVar20 = lVar20 + uVar18;
    } while (lVar10 != lVar15);
  }
  lVar10 = psVar1[4];
  if (lVar20 == 0) {
    if (0 < lVar15) {
      lVar11 = 0;
      do {
        lVar13 = *(long *)(lVar2 + lVar11 * 8);
        lVar20 = *(long *)(lVar2 + 8 + lVar11 * 8);
        if (lVar13 < lVar20) {
          do {
            dVar21 = *(double *)(lVar10 + lVar13 * 8) * c;
            dVar22 = dVar21 + 1.0;
            if (*(long *)(lVar3 + lVar13 * 8) != lVar11) {
              dVar22 = dVar21;
            }
            *(double *)(lVar10 + lVar13 * 8) = dVar22;
            lVar13 = lVar13 + 1;
          } while (lVar20 != lVar13);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != lVar15);
    }
  }
  else {
    uVar18 = *(ulong *)(lVar2 + lVar11 * 8);
    lVar15 = psVar1[2];
    __dest = malloc(lVar13 * 8);
    if ((long)(lVar15 - uVar18) < lVar20) {
      A_00 = SUNSparseMatrix(*psVar1,psVar1[1],uVar18 + lVar20,sparsetype,A->sunctx);
      pvVar8 = A_00->content;
      lVar15 = *(long *)((long)pvVar8 + 0x38);
      if (lVar11 < 1) {
        lVar20 = 0;
      }
      else {
        lVar16 = *(long *)((long)pvVar8 + 0x20);
        lVar12 = *(long *)((long)pvVar8 + 0x30);
        lVar20 = 0;
        lVar14 = 0;
        do {
          *(long *)(lVar15 + lVar14 * 8) = lVar20;
          *(undefined8 *)((long)__dest + lVar14 * 8) = 0;
          lVar17 = *(long *)(lVar2 + lVar14 * 8);
          lVar4 = *(long *)(lVar2 + 8 + lVar14 * 8);
          lVar19 = lVar17;
          if (lVar17 < lVar4) {
            do {
              *(double *)((long)__dest + *(long *)(lVar3 + lVar19 * 8) * 8) =
                   *(double *)(lVar10 + lVar19 * 8) * c;
              lVar19 = lVar19 + 1;
            } while (lVar4 != lVar19);
          }
          if (lVar14 < lVar13) {
            *(double *)((long)__dest + lVar14 * 8) = *(double *)((long)__dest + lVar14 * 8) + 1.0;
          }
          lVar4 = lVar14 + 1;
          lVar19 = *(long *)(lVar2 + lVar4 * 8);
          bVar7 = lVar17 < lVar19;
          if (lVar17 < lVar19) {
            lVar19 = *(long *)(lVar3 + lVar17 * 8);
            while (lVar19 < lVar14) {
              lVar17 = lVar17 + 1;
              *(long *)(lVar12 + lVar20 * 8) = lVar19;
              *(undefined8 *)(lVar16 + lVar20 * 8) =
                   *(undefined8 *)((long)__dest + *(long *)(lVar3 + -8 + lVar17 * 8) * 8);
              lVar20 = lVar20 + 1;
              lVar19 = *(long *)(lVar2 + lVar4 * 8);
              bVar7 = lVar17 < lVar19;
              if (lVar19 <= lVar17) goto LAB_001191b4;
              lVar19 = *(long *)(lVar3 + lVar17 * 8);
            }
            if ((!bVar7) || (*(long *)(lVar3 + lVar17 * 8) != lVar14)) goto LAB_001191b4;
          }
          else {
LAB_001191b4:
            *(long *)(lVar12 + lVar20 * 8) = lVar14;
            *(undefined8 *)(lVar16 + lVar20 * 8) = *(undefined8 *)((long)__dest + lVar14 * 8);
            lVar20 = lVar20 + 1;
          }
          for (; lVar17 < *(long *)(lVar2 + lVar4 * 8); lVar17 = lVar17 + 1) {
            *(undefined8 *)(lVar12 + lVar20 * 8) = *(undefined8 *)(lVar3 + lVar17 * 8);
            *(undefined8 *)(lVar16 + lVar20 * 8) =
                 *(undefined8 *)((long)__dest + *(long *)(lVar3 + lVar17 * 8) * 8);
            lVar20 = lVar20 + 1;
          }
          lVar14 = lVar4;
        } while (lVar4 != lVar11);
      }
      *(long *)(lVar15 + lVar11 * 8) = lVar20;
      pvVar6 = A->content;
      *(undefined8 *)((long)pvVar6 + 0x10) = *(undefined8 *)((long)pvVar8 + 0x10);
      pvVar8 = *(void **)((long)pvVar6 + 0x20);
      if (pvVar8 != (void *)0x0) {
        free(pvVar8);
      }
      pvVar8 = A_00->content;
      pvVar6 = A->content;
      *(undefined8 *)((long)pvVar6 + 0x20) = *(undefined8 *)((long)pvVar8 + 0x20);
      *(undefined8 *)((long)pvVar8 + 0x20) = 0;
      pvVar8 = *(void **)((long)pvVar6 + 0x30);
      if (pvVar8 != (void *)0x0) {
        free(pvVar8);
      }
      pvVar8 = A_00->content;
      pvVar6 = A->content;
      *(undefined8 *)((long)pvVar6 + 0x30) = *(undefined8 *)((long)pvVar8 + 0x30);
      *(undefined8 *)((long)pvVar8 + 0x30) = 0;
      pvVar8 = *(void **)((long)pvVar6 + 0x38);
      if (pvVar8 != (void *)0x0) {
        free(pvVar8);
      }
      pvVar8 = A_00->content;
      *(undefined8 *)((long)A->content + 0x38) = *(undefined8 *)((long)pvVar8 + 0x38);
      *(undefined8 *)((long)pvVar8 + 0x38) = 0;
      SUNMatDestroy_Sparse(A_00);
      pvVar8 = __dest;
    }
    else {
      pvVar8 = malloc(lVar13 * 8);
      lVar20 = lVar20 + uVar18;
      *(long *)(lVar2 + lVar11 * 8) = lVar20;
      if (0 < lVar11) {
        do {
          *(undefined8 *)((long)pvVar8 + lVar11 * 8 + -8) = 0;
          uVar5 = *(ulong *)(lVar2 + -8 + lVar11 * 8);
          lVar15 = uVar18 - uVar5;
          if (lVar15 != 0 && (long)uVar5 <= (long)uVar18) {
            memcpy(__dest,(void *)(uVar5 * 8 + lVar3),lVar15 * 8);
            uVar9 = uVar5;
            do {
              *(double *)((long)pvVar8 + *(long *)(lVar3 + uVar9 * 8) * 8) =
                   *(double *)(lVar10 + uVar9 * 8) * c;
              uVar9 = uVar9 + 1;
            } while (uVar18 != uVar9);
          }
          lVar16 = lVar11 + -1;
          if (lVar11 <= lVar13) {
            *(double *)((long)pvVar8 + lVar16 * 8) = *(double *)((long)pvVar8 + lVar16 * 8) + 1.0;
          }
          lVar12 = ~uVar5 + uVar18;
          if (-1 < lVar12) {
            lVar14 = 0;
            do {
              lVar12 = *(long *)((long)__dest + lVar14 * 8 + uVar18 * 8 + uVar5 * -8 + -8);
              if (lVar12 < lVar11) {
                lVar12 = lVar15 + lVar14 + -1;
                lVar20 = lVar20 + lVar14;
                goto LAB_00119392;
              }
              *(long *)(lVar3 + -8 + lVar20 * 8 + lVar14 * 8) = lVar12;
              *(undefined8 *)(lVar10 + -8 + lVar20 * 8 + lVar14 * 8) =
                   *(undefined8 *)((long)pvVar8 + lVar12 * 8);
              lVar12 = lVar15 + lVar14;
              lVar14 = lVar14 + -1;
            } while (lVar12 != 1 && -1 < lVar12 + -1);
            lVar20 = lVar20 + lVar14;
            lVar12 = -1;
          }
LAB_00119392:
          if ((lVar12 < 0) || (*(long *)((long)__dest + lVar12 * 8) != lVar16)) {
            *(long *)(lVar3 + -8 + lVar20 * 8) = lVar16;
            *(undefined8 *)(lVar10 + -8 + lVar20 * 8) = *(undefined8 *)((long)pvVar8 + lVar16 * 8);
            lVar20 = lVar20 + -1;
          }
          if (-1 < lVar12) {
            lVar12 = lVar12 + 1;
            lVar15 = lVar20;
            do {
              lVar14 = *(long *)((long)__dest + lVar12 * 8 + -8);
              lVar20 = lVar15 + -1;
              *(long *)(lVar3 + -8 + lVar15 * 8) = lVar14;
              *(undefined8 *)(lVar10 + -8 + lVar15 * 8) = *(undefined8 *)((long)pvVar8 + lVar14 * 8)
              ;
              lVar12 = lVar12 + -1;
              lVar15 = lVar20;
            } while (0 < lVar12);
          }
          uVar18 = *(ulong *)(lVar2 + lVar16 * 8);
          *(long *)(lVar2 + lVar16 * 8) = lVar20;
          bVar7 = 1 < lVar11;
          lVar11 = lVar16;
        } while (bVar7);
      }
      free(__dest);
    }
    free(pvVar8);
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatScaleAddI_Sparse(sunrealtype c, SUNMatrix A)
{
  sunindextype j, i, p, nz, newvals, M, N, cend, nw;
  sunbooleantype newmat, found;
  sunindextype *w, *Ap, *Ai, *Cp, *Ci;
  sunrealtype *x, *Ax, *Cx;
  SUNMatrix C;
  SUNFunctionBegin(A->sunctx);

  /* store shortcuts to matrix dimensions (M is inner dimension, N is outer) */
  if (SM_SPARSETYPE_S(A) == CSC_MAT)
  {
    M = SM_ROWS_S(A);
    N = SM_COLUMNS_S(A);
  }
  else
  {
    M = SM_COLUMNS_S(A);
    N = SM_ROWS_S(A);
  }

  /* access data arrays from A */
  Ap = NULL;
  Ai = NULL;
  Ax = NULL;
  Ap = SM_INDEXPTRS_S(A);
  SUNAssert(Ap, SUN_ERR_ARG_CORRUPT);
  Ai = SM_INDEXVALS_S(A);
  SUNAssert(Ai, SUN_ERR_ARG_CORRUPT);
  Ax = SM_DATA_S(A);
  SUNAssert(Ax, SUN_ERR_ARG_CORRUPT);

  /* determine if A: contains values on the diagonal (so I can just be added
     in); if not, then increment counter for extra storage that should be
     required. */
  newvals = 0;
  for (j = 0; j < SUNMIN(M, N); j++)
  {
    /* scan column (row if CSR) of A, searching for diagonal value */
    found = SUNFALSE;
    for (i = Ap[j]; i < Ap[j + 1]; i++)
    {
      if (Ai[i] == j)
      {
        found = SUNTRUE;
        break;
      }
    }
    /* if no diagonal found, increment necessary storage counter */
    if (!found) { newvals += 1; }
  }

  /* If extra nonzeros required, check whether matrix has sufficient storage
     space for new nonzero entries  (so I can be inserted into existing storage)
   */
  newmat = SUNFALSE; /* no reallocation needed */
  if (newvals > (SM_NNZ_S(A) - Ap[N])) { newmat = SUNTRUE; }

  /* perform operation based on existing/necessary structure */

  /*   case 1: A already contains a diagonal */
  if (newvals == 0)
  {
    /* iterate through columns, adding 1.0 to diagonal */
    for (j = 0; j < SUNMIN(M, N); j++)
    {
      for (i = Ap[j]; i < Ap[j + 1]; i++)
      {
        if (Ai[i] == j) { Ax[i] = ONE + c * Ax[i]; }
        else { Ax[i] = c * Ax[i]; }
      }
    }

    /*   case 2: A has sufficient storage, but does not already contain a
     * diagonal */
  }
  else if (!newmat)
  {
    /* create work arrays for nonzero row (column) indices and values in a
     * single column (row) */
    w = (sunindextype*)malloc(M * sizeof(sunindextype));
    SUNAssert(w, SUN_ERR_MALLOC_FAIL);
    x = (sunrealtype*)malloc(M * sizeof(sunrealtype));
    SUNAssert(x, SUN_ERR_MALLOC_FAIL);

    /* determine storage location where last column (row) should end */
    nz = Ap[N] + newvals;

    /* store pointer past last column (row) from original A,
       and store updated value in revised A */
    cend  = Ap[N];
    Ap[N] = nz;

    /* iterate through columns (rows) backwards */
    for (j = N - 1; j >= 0; j--)
    {
      /* reset diagonal entry, in case it's not in A */
      x[j] = ZERO;

      /* iterate down column (row) of A, collecting nonzeros */
      for (p = Ap[j], i = 0; p < cend; p++, i++)
      {
        w[i]     = Ai[p];     /* collect row (column) index */
        x[Ai[p]] = c * Ax[p]; /* collect/scale value */
      }

      /* NNZ in this column (row) */
      nw = cend - Ap[j];

      /* add identity to this column (row) */
      if (j < M) { x[j] += ONE; /* update value */ }

      /* fill entries of A with this column's (row's) data */
      /* fill entries past diagonal */
      for (i = nw - 1; i >= 0 && w[i] > j; i--)
      {
        Ai[--nz] = w[i];
        Ax[nz]   = x[w[i]];
      }
      /* fill diagonal if applicable */
      if (i < 0 /* empty or insert at front */ ||
          w[i] != j /* insert behind front */)
      {
        Ai[--nz] = j;
        Ax[nz]   = x[j];
      }
      /* fill entries before diagonal */
      for (; i >= 0; i--)
      {
        Ai[--nz] = w[i];
        Ax[nz]   = x[w[i]];
      }

      /* store ptr past this col (row) from orig A, update value for new A */
      cend  = Ap[j];
      Ap[j] = nz;
    }

    /* clean up */
    free(w);
    free(x);

    /*   case 3: A must be reallocated with sufficient storage */
  }
  else
  {
    /* create work array for nonzero values in a single column (row) */
    x = (sunrealtype*)malloc(M * sizeof(sunrealtype));

    /* create new matrix for sum */
    C = SUNSparseMatrix(SM_ROWS_S(A), SM_COLUMNS_S(A), Ap[N] + newvals,
                        SM_SPARSETYPE_S(A), A->sunctx);
    SUNCheckLastErr();

    /* access data from CSR structures (return if failure) */
    Cp = NULL;
    Ci = NULL;
    Cx = NULL;
    Cp = SM_INDEXPTRS_S(C);
    SUNAssert(Cp, SUN_ERR_ARG_CORRUPT);
    Ci = SM_INDEXVALS_S(C);
    SUNAssert(Ci, SUN_ERR_ARG_CORRUPT);
    Cx = SM_DATA_S(C);
    SUNAssert(Cx, SUN_ERR_ARG_CORRUPT);

    /* initialize total nonzero count */
    nz = 0;

    /* iterate through columns (rows for CSR) */
    for (j = 0; j < N; j++)
    {
      /* set current column (row) pointer to current # nonzeros */
      Cp[j] = nz;

      /* reset diagonal entry, in case it's not in A */
      x[j] = ZERO;

      /* iterate down column (along row) of A, collecting nonzeros */
      for (p = Ap[j]; p < Ap[j + 1]; p++)
      {
        x[Ai[p]] = c * Ax[p]; /* collect/scale value */
      }

      /* add identity to this column (row) */
      if (j < M) { x[j] += ONE; /* update value */ }

      /* fill entries of C with this column's (row's) data */
      /* fill entries before diagonal */
      for (p = Ap[j]; p < Ap[j + 1] && Ai[p] < j; p++)
      {
        Ci[nz]   = Ai[p];
        Cx[nz++] = x[Ai[p]];
      }
      /* fill diagonal if applicable */
      if (p >= Ap[j + 1] /* empty or insert at end */ ||
          Ai[p] != j /* insert before end */)
      {
        Ci[nz]   = j;
        Cx[nz++] = x[j];
      }
      /* fill entries past diagonal */
      for (; p < Ap[j + 1]; p++)
      {
        Ci[nz]   = Ai[p];
        Cx[nz++] = x[Ai[p]];
      }
    }

    /* indicate end of data */
    Cp[N] = nz;

    /* update A's structure with C's values; nullify C's pointers */
    SM_NNZ_S(A) = SM_NNZ_S(C);

    if (SM_DATA_S(A)) { free(SM_DATA_S(A)); }
    SM_DATA_S(A) = SM_DATA_S(C);
    SM_DATA_S(C) = NULL;

    if (SM_INDEXVALS_S(A)) { free(SM_INDEXVALS_S(A)); }
    SM_INDEXVALS_S(A) = SM_INDEXVALS_S(C);
    SM_INDEXVALS_S(C) = NULL;

    if (SM_INDEXPTRS_S(A)) { free(SM_INDEXPTRS_S(A)); }
    SM_INDEXPTRS_S(A) = SM_INDEXPTRS_S(C);
    SM_INDEXPTRS_S(C) = NULL;

    /* clean up */
    SUNMatDestroy_Sparse(C);
    free(x);
  }
  return SUN_SUCCESS;
}